

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void highsReportLogOptions(HighsLogOptions *log_options_)

{
  undefined8 uVar1;
  long *in_RDI;
  HighsInt in_stack_00000018;
  undefined1 in_stack_0000001f;
  string local_58 [48];
  string local_28 [32];
  long *local_8;
  
  local_8 = in_RDI;
  printf("\nHighs log options\n");
  if (*local_8 == 0) {
    printf("   log_stream = NULL\n");
  }
  else {
    printf("   log_stream = Not NULL\n");
  }
  highsBoolToString_abi_cxx11_((bool)in_stack_0000001f,in_stack_00000018);
  uVar1 = std::__cxx11::string::c_str();
  printf("   output_flag = %s\n",uVar1);
  std::__cxx11::string::~string(local_28);
  highsBoolToString_abi_cxx11_((bool)in_stack_0000001f,in_stack_00000018);
  uVar1 = std::__cxx11::string::c_str();
  printf("   log_to_console = %s\n",uVar1);
  std::__cxx11::string::~string(local_58);
  printf("   log_dev_level = %d\n\n",(ulong)*(uint *)local_8[3]);
  return;
}

Assistant:

void highsReportLogOptions(const HighsLogOptions& log_options_) {
  printf("\nHighs log options\n");
  if (log_options_.log_stream == NULL) {
    printf("   log_stream = NULL\n");
  } else {
    printf("   log_stream = Not NULL\n");
  }
  printf("   output_flag = %s\n",
         highsBoolToString(*log_options_.output_flag).c_str());
  printf("   log_to_console = %s\n",
         highsBoolToString(*log_options_.log_to_console).c_str());
  printf("   log_dev_level = %" HIGHSINT_FORMAT "\n\n",
         *log_options_.log_dev_level);
}